

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigConstr2.c
# Opt level: O2

Vec_Vec_t *
Ssw_ManFindDirectImplications(Aig_Man_t *p,int nFrames,int nConfs,int nProps,int fVerbose)

{
  Aig_Obj_t *pAVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Vec_Vec_t *p_00;
  Aig_Man_t *p_01;
  Cnf_Dat_t *p_02;
  sat_solver *s;
  Aig_Obj_t *pObj;
  Aig_Obj_t *pAVar5;
  Vec_Ptr_t *pVVar6;
  int iVar7;
  int *piVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  uint i;
  ulong uVar13;
  
  piVar8 = (int *)(ulong)(uint)nProps;
  p_00 = Vec_VecAlloc(nFrames);
  p_01 = Saig_ManUnrollCOI(p,nFrames);
  if (p_01->nObjs[3] == 1) {
    iVar9 = 0;
    p_02 = Cnf_DeriveSimple(p_01,0);
    s = (sat_solver *)Cnf_DataWriteIntoSolver(p_02,1,0);
    if (s != (sat_solver *)0x0) {
      Aig_ManIncrementTravId(p);
      piVar8 = (int *)0x0;
      if (0 < nFrames) {
        piVar8 = (int *)(ulong)(uint)nFrames;
      }
      iVar7 = (int)piVar8;
      iVar11 = nFrames;
      while( true ) {
        iVar11 = iVar11 + -1;
        if (iVar9 == iVar7) break;
        iVar12 = iVar11;
        for (lVar10 = 0; lVar10 < p->vObjs->nSize; lVar10 = lVar10 + 1) {
          pObj = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,(int)lVar10);
          if (pObj != (Aig_Obj_t *)0x0) {
            iVar2 = Aig_ObjIsCand(pObj);
            if ((iVar2 != 0) && (pObj->TravId != p->nTravIds)) {
              pAVar1 = p->pObjCopies[iVar12];
              piVar8 = p_02->pVarNums;
              if (-1 < piVar8[*(int *)(((ulong)pAVar1 & 0xfffffffffffffffe) + 0x24)]) {
                iVar2 = sat_solver_get_var_value
                                  (s,piVar8[*(int *)(((ulong)pAVar1 & 0xfffffffffffffffe) + 0x24)]);
                if (iVar2 != 0) {
                  pObj->TravId = p->nTravIds;
                  iVar3 = Saig_ObjIsLo(p,pObj);
                  if (iVar3 != 0) {
                    pAVar5 = Saig_ObjLoToLi(p,pObj);
                    piVar8 = (int *)(ulong)(uint)p->nTravIds;
                    *(int *)(((ulong)pAVar5->pFanin0 & 0xfffffffffffffffe) + 0x20) = p->nTravIds;
                  }
                  Vec_VecPush(p_00,iVar9,
                              (void *)((ulong)((uint)pAVar1 & 1) ^ (ulong)pObj ^ (ulong)(iVar2 == 1)
                                      ));
                }
              }
            }
          }
          iVar12 = iVar12 + nFrames;
        }
        iVar9 = iVar9 + 1;
      }
      sat_solver_delete(s);
    }
    Aig_ManStop(p_01);
    Cnf_DataFree(p_02);
    iVar9 = (int)piVar8;
    if (fVerbose != 0) {
      uVar4 = Vec_VecSizeSize(p_00);
      printf("Found %3d candidates.\n",(ulong)uVar4);
      iVar11 = p_00->nSize;
      if (iVar11 < 1) {
        iVar11 = 0;
      }
      uVar13 = 0;
      while( true ) {
        iVar9 = (int)piVar8;
        iVar7 = (int)uVar13;
        if (iVar11 == iVar7) break;
        pVVar6 = Vec_VecEntry(p_00,iVar7);
        printf("Level %d. Cands  =%d    ",uVar13,(ulong)(uint)pVVar6->nSize);
        putchar(10);
        uVar13 = (ulong)(iVar7 + 1);
      }
    }
    if (p->pObjCopies != (Aig_Obj_t **)0x0) {
      free(p->pObjCopies);
      p->pObjCopies = (Aig_Obj_t **)0x0;
    }
    Saig_ManFilterUsingInd(p,p_00,nConfs,iVar9,fVerbose);
    iVar9 = Vec_VecSizeSize(p_00);
    if (iVar9 != 0) {
      uVar4 = Vec_VecSizeSize(p_00);
      printf("Found %3d constraints after filtering.\n",(ulong)uVar4);
    }
    if (fVerbose != 0) {
      uVar4 = p_00->nSize;
      if (p_00->nSize < 1) {
        uVar4 = 0;
      }
      for (i = 0; uVar4 != i; i = i + 1) {
        pVVar6 = Vec_VecEntry(p_00,i);
        printf("Level %d. Constr =%d    ",(ulong)i,(ulong)(uint)pVVar6->nSize);
        putchar(10);
      }
    }
    return p_00;
  }
  __assert_fail("Aig_ManCoNum(pFrames) == 1",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigConstr2.c"
                ,0x244,"Vec_Vec_t *Ssw_ManFindDirectImplications(Aig_Man_t *, int, int, int, int)");
}

Assistant:

Vec_Vec_t * Ssw_ManFindDirectImplications( Aig_Man_t * p, int nFrames, int nConfs, int nProps, int fVerbose )
{
    Vec_Vec_t * vCands = NULL;
    Vec_Ptr_t * vNodes;
    Cnf_Dat_t * pCnf;
    sat_solver * pSat;
    Aig_Man_t * pFrames;
    Aig_Obj_t * pObj, * pRepr, * pReprR;
    int i, f, k, value;
    vCands = Vec_VecAlloc( nFrames );

    // perform unrolling
    pFrames = Saig_ManUnrollCOI( p, nFrames );
    assert( Aig_ManCoNum(pFrames) == 1 );
    // start the SAT solver
    pCnf = Cnf_DeriveSimple( pFrames, 0 );
    pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
    if ( pSat != NULL )
    {
        Aig_ManIncrementTravId( p );
        for ( f = 0; f < nFrames; f++ )
        {
            Aig_ManForEachObj( p, pObj, i )
            {
                if ( !Aig_ObjIsCand(pObj) )
                    continue;
                if ( Aig_ObjIsTravIdCurrent(p, pObj) )
                    continue;
                // get the node from timeframes
                pRepr  = p->pObjCopies[nFrames*i + nFrames-1-f];
                pReprR = Aig_Regular(pRepr);
                if ( pCnf->pVarNums[Aig_ObjId(pReprR)] < 0 )
                    continue;
//                value = pSat->assigns[ pCnf->pVarNums[Aig_ObjId(pReprR)] ];
                value = sat_solver_get_var_value( pSat, pCnf->pVarNums[Aig_ObjId(pReprR)] );
                if ( value == l_Undef )
                    continue;
                // label this node as taken
                Aig_ObjSetTravIdCurrent(p, pObj);
                if ( Saig_ObjIsLo(p, pObj) )
                    Aig_ObjSetTravIdCurrent( p, Aig_ObjFanin0(Saig_ObjLoToLi(p, pObj)) );
                // remember the node
                Vec_VecPush( vCands, f, Aig_NotCond( pObj, (value == l_True) ^ Aig_IsComplement(pRepr) ) );
        //        printf( "%s%d ", (value == l_False)? "":"!", i );
            }
        }
    //    printf( "\n" );
        sat_solver_delete( pSat );
    }
    Aig_ManStop( pFrames );
    Cnf_DataFree( pCnf );

    if ( fVerbose )
    {
        printf( "Found %3d candidates.\n", Vec_VecSizeSize(vCands) );
        Vec_VecForEachLevel( vCands, vNodes, k )
        {
            printf( "Level %d. Cands  =%d    ", k, Vec_PtrSize(vNodes) );
//            Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
//                printf( "%d:%s%d ", k, Aig_IsComplement(pObj)? "!":"", Aig_ObjId(Aig_Regular(pObj)) );
            printf( "\n" );
        }
    }

    ABC_FREE( p->pObjCopies );
    Saig_ManFilterUsingInd( p, vCands, nConfs, nProps, fVerbose );
    if ( Vec_VecSizeSize(vCands) )
        printf( "Found %3d constraints after filtering.\n", Vec_VecSizeSize(vCands) );
    if ( fVerbose )
    {
        Vec_VecForEachLevel( vCands, vNodes, k )
        {
            printf( "Level %d. Constr =%d    ", k, Vec_PtrSize(vNodes) );
//            Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
//                printf( "%d:%s%d ", k, Aig_IsComplement(pObj)? "!":"", Aig_ObjId(Aig_Regular(pObj)) );
            printf( "\n" );
        }
    }

    return vCands;
}